

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O0

BasicMutSuffix<int> __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::Add<int>
          (BasicSuffixSet<std::allocator<char>_> *this,StringRef name,int kind,int num_values,
          SuffixTable *table)

{
  SuffixImpl *pSVar1;
  int *ptr;
  BasicSuffixSet<std::allocator<char>_> *in_RDX;
  size_t in_RSI;
  BasicMutSuffix<int> *in_RDI;
  int in_R8D;
  int *values;
  SuffixImpl *impl;
  SuffixTable *in_stack_000000c0;
  int in_stack_000000c8;
  int in_stack_000000cc;
  BasicSuffixSet<std::allocator<char>_> *in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  Impl *in_stack_ffffffffffffff98;
  int __n;
  BasicSuffix<int> local_8;
  
  pSVar1 = DoAdd(in_stack_000000d0,(StringRef)in_stack_000000d8,in_stack_000000cc,in_stack_000000c8,
                 in_stack_000000c0);
  if (in_R8D != 0) {
    ptr = Allocate<int>(in_RDX,in_RSI);
    __n = (int)(in_RSI >> 0x20);
    fmt::internal::make_ptr<int>(ptr,(long)in_R8D);
    std::fill_n<int*,int,int>((int *)in_RDX,__n,ptr);
    (pSVar1->field_3).int_values = ptr;
  }
  BasicMutSuffix<int>::BasicMutSuffix(in_RDI,in_stack_ffffffffffffff98);
  return (BasicMutSuffix<int>)local_8.super_SuffixBase.impl_;
}

Assistant:

BasicMutSuffix<T> Add(fmt::StringRef name, int kind, int num_values,
                        const SuffixTable& table = {}) {
    MP_ASSERT((kind & suf::FLOAT) == 0 ||
              (kind & suf::FLOAT) == internal::SuffixInfo<T>::KIND,
              "invalid suffix kind");
    SuffixImpl *impl = DoAdd(
          name, kind | internal::SuffixInfo<T>::KIND, num_values, table);
    if (num_values != 0) {
      T *values = Allocate<T>(num_values);
      std::fill_n(fmt::internal::make_ptr(values, num_values), num_values, 0);
      impl->values = values;
    }
    return BasicMutSuffix<T>(impl);
  }